

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_3::RgbaYca::YCAtoRGBA(V3f *yw,int n,Rgba *ycaIn,Rgba *rgbaOut)

{
  long lVar1;
  undefined2 *puVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  float fVar3;
  float g;
  float b;
  float r;
  float Y;
  Rgba *out;
  Rgba *in;
  int i;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  int local_24;
  
  local_24 = 0;
  do {
    if (in_ESI <= local_24) {
      return;
    }
    lVar1 = in_RDX + (long)local_24 * 8;
    puVar2 = (undefined2 *)(in_RCX + (long)local_24 * 8);
    fVar3 = Imath_3_1::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (fVar3 == 0.0) {
      fVar3 = Imath_3_1::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if ((fVar3 != 0.0) || (NAN(fVar3))) goto LAB_001422c1;
      *puVar2 = *(undefined2 *)(lVar1 + 2);
      puVar2[1] = *(undefined2 *)(lVar1 + 2);
      puVar2[2] = *(undefined2 *)(lVar1 + 2);
      puVar2[3] = *(undefined2 *)(lVar1 + 6);
    }
    else {
LAB_001422c1:
      in_stack_ffffffffffffffc4 =
           Imath_3_1::half::operator_cast_to_float
                     ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      fVar3 = Imath_3_1::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffc0 = (fVar3 + 1.0) * in_stack_ffffffffffffffc4;
      fVar3 = Imath_3_1::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      fVar3 = (fVar3 + 1.0) * in_stack_ffffffffffffffc4;
      Imath_3_1::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),fVar3);
      Imath_3_1::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),fVar3);
      Imath_3_1::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),fVar3);
      puVar2[3] = *(undefined2 *)(lVar1 + 6);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void
YCAtoRGBA (
    const IMATH_NAMESPACE::V3f& yw,
    int                         n,
    const Rgba                  ycaIn[/*n*/],
    Rgba                        rgbaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        const Rgba& in  = ycaIn[i];
        Rgba&       out = rgbaOut[i];

        if (in.r == 0 && in.b == 0)
        {
            //
            // Special case -- both chroma channels are 0.  To avoid
            // rounding errors, we explicitly set the output R, G and B
            // channels equal to the input luminance.
            //
            // The special cases here and in RGBAtoYCA() ensure that
            // converting black-and white images from RGBA to YCA and
            // back is lossless.
            //

            out.r = in.g;
            out.g = in.g;
            out.b = in.g;
            out.a = in.a;
        }
        else
        {
            float Y = in.g;
            float r = (in.r + 1) * Y;
            float b = (in.b + 1) * Y;
            float g = (Y - r * yw.x - b * yw.z) / yw.y;

            out.r = r;
            out.g = g;
            out.b = b;
            out.a = in.a;
        }
    }
}